

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::write_ptr<char,fmt::v9::appender,unsigned_long>
                   (appender out,unsigned_long value,basic_format_specs<char> *specs)

{
  unsigned_long uVar1;
  int value_00;
  type tVar2;
  appender *paVar3;
  appender it;
  undefined1 local_48 [8];
  anon_class_16_2_92d121e5 write;
  size_t size;
  int num_digits;
  basic_format_specs<char> *specs_local;
  unsigned_long value_local;
  appender out_local;
  
  value_local = (unsigned_long)
                out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  value_00 = count_digits<4,unsigned_long>(value);
  tVar2 = to_unsigned<int>(value_00);
  uVar1 = value_local;
  write._8_8_ = (ulong)tVar2 + 2;
  local_48 = (undefined1  [8])value;
  write.value._0_4_ = value_00;
  if (specs == (basic_format_specs<char> *)0x0) {
    paVar3 = reserve<fmt::v9::appender>((appender *)&value_local,write._8_8_);
    it = write_ptr<char,_fmt::v9::appender,_unsigned_long>::anon_class_16_2_92d121e5::operator()
                   ((anon_class_16_2_92d121e5 *)local_48,
                    (reserve_iterator<fmt::v9::appender>)
                    (paVar3->super_back_insert_iterator<fmt::v9::detail::buffer<char>_>).container);
    out_local = base_iterator<fmt::v9::appender>((appender)uVar1,it);
  }
  else {
    out_local = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_ptr<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,unsigned_long,fmt::v9::basic_format_specs<char>const*)::_lambda(fmt::v9::appender)_1_&>
                          ((appender)value_local,specs,write._8_8_,
                           (anon_class_16_2_92d121e5 *)local_48);
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value,
               const basic_format_specs<Char>* specs) -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}